

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdb.c
# Opt level: O1

int mdb_env_cwalk(mdb_copy *my,pgno_t *pg,int flags)

{
  MDB_page *pMVar1;
  undefined8 *puVar2;
  int iVar3;
  MDB_env *pMVar4;
  char *pcVar5;
  pgno_t pVar6;
  MDB_page *pMVar7;
  bool bVar8;
  int iVar9;
  MDB_page *dst;
  ulong uVar10;
  ulong uVar11;
  ushort uVar12;
  uint uVar13;
  long lVar14;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  MDB_page *mp;
  MDB_db db;
  MDB_cursor mc;
  int local_22c;
  MDB_page *local_220;
  uint local_214;
  MDB_page *local_210;
  anon_union_8_2_b62042e6_for_mp_p *local_208;
  char *local_200;
  char *local_1f8;
  ulong local_1f0;
  MDB_page *local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  pgno_t pStack_1c0;
  MDB_cursor local_1b8;
  
  if (*pg == 0xffffffffffffffff) {
    iVar9 = 0;
  }
  else {
    local_1b8.mc_snum = 1;
    local_1b8.mc_top = 0;
    local_1b8.mc_txn = my->mc_txn;
    iVar9 = mdb_page_get(&local_1b8,*pg,local_1b8.mc_pg,(int *)0x0);
    if ((iVar9 == 0) && (iVar9 = mdb_page_search_root(&local_1b8,(MDB_val *)0x0,4), iVar9 == 0)) {
      pMVar4 = my->mc_env;
      dst = (MDB_page *)malloc((ulong)((local_1b8._64_4_ & 0xffff) * pMVar4->me_psize));
      if (dst == (MDB_page *)0x0) {
        iVar9 = 0xc;
      }
      else {
        uVar10 = (ulong)local_1b8.mc_top;
        local_214 = flags;
        local_210 = dst;
        local_208 = (anon_union_8_2_b62042e6_for_mp_p *)pg;
        if (uVar10 != 0) {
          uVar16 = 0;
          do {
            mdb_page_copy(dst,local_1b8.mc_pg[uVar16],pMVar4->me_psize);
            local_1b8.mc_pg[uVar16] = dst;
            dst = (MDB_page *)((long)dst->mp_ptrs + ((ulong)pMVar4->me_psize - 0x10));
            uVar16 = uVar16 + 1;
          } while (uVar10 != uVar16);
        }
        if (local_1b8.mc_snum == 0) {
          iVar9 = 0;
        }
        else {
          local_22c = my->mc_toggle;
          local_214 = local_214 & 4;
          iVar9 = 0;
          do {
            uVar10 = (ulong)local_1b8.mc_top;
            local_220 = local_1b8.mc_pg[uVar10];
            uVar13 = (local_220->mp_pb).pb.pb_lower - 0x10;
            uVar15 = uVar13 >> 1;
            if ((local_220->mp_flags & 2) == 0) {
              uVar12 = local_1b8.mc_ki[uVar10] + 1;
              local_1b8.mc_ki[uVar10] = uVar12;
              if (uVar15 <= uVar12) goto LAB_0011066a;
              while( true ) {
                iVar9 = mdb_page_get(&local_1b8,
                                     (ulong)CONCAT24(*(undefined2 *)
                                                      ((long)local_220->mp_ptrs +
                                                      ((ulong)local_220->mp_ptrs
                                                              [local_1b8.mc_ki[local_1b8.mc_top]] -
                                                      0xc)),*(undefined4 *)
                                                             ((long)local_220->mp_ptrs +
                                                             ((ulong)local_220->mp_ptrs
                                                                     [local_1b8.mc_ki
                                                                      [local_1b8.mc_top]] - 0x10))),
                                     &local_220,(int *)0x0);
                if (iVar9 != 0) break;
                uVar12 = local_1b8.mc_top + 1;
                local_1b8.mc_top = uVar12;
                local_1b8.mc_snum = local_1b8.mc_snum + 1;
                local_1b8.mc_ki[uVar12] = 0;
                if ((local_220->mp_flags & 1) == 0) {
                  local_1b8.mc_pg[uVar12] = local_220;
                  uVar13 = 5;
                  goto LAB_001107a8;
                }
                mdb_page_copy(local_1b8.mc_pg[uVar12],local_220,my->mc_env->me_psize);
              }
LAB_00110691:
              uVar13 = 10;
            }
            else {
              if (((local_220->mp_flags & 0x20) == 0 && local_214 == 0) && (1 < uVar13)) {
                uVar10 = (ulong)(uVar15 + (uVar15 == 0));
                uVar16 = 0;
                local_1f0 = uVar10;
                do {
                  lVar17 = (long)local_220->mp_ptrs + ((ulong)local_220->mp_ptrs[uVar16] - 0x10);
                  uVar12 = *(ushort *)
                            ((long)local_220->mp_ptrs + ((ulong)local_220->mp_ptrs[uVar16] - 0xc));
                  if ((uVar12 & 1) == 0) {
                    if ((uVar12 & 2) != 0) {
                      if (local_220 != dst) {
                        local_1b8.mc_pg[local_1b8.mc_top] = dst;
                        mdb_page_copy(dst,local_220,my->mc_env->me_psize);
                        lVar17 = (long)dst->mp_ptrs + ((ulong)dst->mp_ptrs[uVar16] - 0x10);
                        local_220 = dst;
                      }
                      uVar11 = (ulong)*(ushort *)(lVar17 + 6);
                      puVar2 = (undefined8 *)(lVar17 + 8 + uVar11);
                      local_1e8 = (MDB_page *)*puVar2;
                      uStack_1e0 = puVar2[1];
                      puVar2 = (undefined8 *)(lVar17 + 0x18 + uVar11);
                      local_1d8 = *puVar2;
                      uStack_1d0 = puVar2[1];
                      puVar2 = (undefined8 *)(lVar17 + 0x28 + uVar11);
                      local_1c8 = *puVar2;
                      pStack_1c0 = puVar2[1];
                      my->mc_toggle = local_22c;
                      iVar9 = mdb_env_cwalk(my,&pStack_1c0,*(ushort *)(lVar17 + 4) & 4);
                      uVar13 = 10;
                      if (iVar9 != 0) goto LAB_001107a8;
                      local_22c = my->mc_toggle;
                      uVar11 = (ulong)*(ushort *)(lVar17 + 6);
                      puVar2 = (undefined8 *)(lVar17 + 0x28 + uVar11);
                      *puVar2 = local_1c8;
                      puVar2[1] = pStack_1c0;
                      puVar2 = (undefined8 *)(lVar17 + 0x18 + uVar11);
                      *puVar2 = local_1d8;
                      puVar2[1] = uStack_1d0;
                      puVar2 = (undefined8 *)(lVar17 + 8 + uVar11);
                      *puVar2 = local_1e8;
                      puVar2[1] = uStack_1e0;
                    }
                  }
                  else {
                    if (local_220 != dst) {
                      local_1b8.mc_pg[local_1b8.mc_top] = dst;
                      mdb_page_copy(dst,local_220,my->mc_env->me_psize);
                      lVar17 = (long)dst->mp_ptrs + ((ulong)dst->mp_ptrs[uVar16] - 0x10);
                      local_220 = dst;
                    }
                    bVar8 = false;
                    iVar9 = mdb_page_get(&local_1b8,
                                         *(pgno_t *)(lVar17 + 8 + (ulong)*(ushort *)(lVar17 + 6)),
                                         &local_1e8,(int *)0x0);
                    uVar13 = 10;
                    if (iVar9 == 0) {
                      if (my->mc_wlen[local_22c] < 0x100000) {
LAB_0011057a:
                        pMVar1 = local_1e8;
                        lVar14 = (long)local_22c;
                        local_1f8 = my->mc_wbuf[lVar14];
                        iVar9 = my->mc_wlen[lVar14];
                        local_200 = local_1f8 + iVar9;
                        memcpy(local_200,local_1e8,(ulong)my->mc_env->me_psize);
                        *(pgno_t *)(local_1f8 + iVar9) = my->mc_next_pgno;
                        my->mc_next_pgno = my->mc_next_pgno + (ulong)(pMVar1->mp_pb).pb_pages;
                        pMVar4 = my->mc_env;
                        my->mc_wlen[lVar14] = my->mc_wlen[lVar14] + pMVar4->me_psize;
                        if (1 < (pMVar1->mp_pb).pb_pages) {
                          my->mc_olen[lVar14] = ((pMVar1->mp_pb).pb_pages - 1) * pMVar4->me_psize;
                          my->mc_over[lVar14] =
                               (char *)((long)pMVar1->mp_ptrs + ((ulong)pMVar4->me_psize - 0x10));
                          iVar9 = mdb_env_cthr_toggle(my,1);
                          if (iVar9 != 0) goto LAB_00110621;
                          local_22c = my->mc_toggle;
                        }
                        *(undefined8 *)(lVar17 + 8 + (ulong)*(ushort *)(lVar17 + 6)) =
                             *(undefined8 *)local_200;
                        bVar8 = true;
                        iVar9 = 0;
                        uVar13 = 0;
                      }
                      else {
                        iVar9 = mdb_env_cthr_toggle(my,1);
                        if (iVar9 == 0) {
                          local_22c = my->mc_toggle;
                          goto LAB_0011057a;
                        }
LAB_00110621:
                        bVar8 = false;
                        uVar13 = 10;
                      }
                    }
                    uVar10 = local_1f0;
                    if (!bVar8) goto LAB_001107a8;
                  }
                  uVar16 = uVar16 + 1;
                } while (uVar10 != uVar16);
              }
LAB_0011066a:
              if (0xfffff < my->mc_wlen[local_22c]) {
                iVar9 = mdb_env_cthr_toggle(my,1);
                if (iVar9 != 0) goto LAB_00110691;
                local_22c = my->mc_toggle;
                iVar9 = 0;
              }
              lVar17 = (long)local_22c;
              pcVar5 = my->mc_wbuf[lVar17];
              iVar3 = my->mc_wlen[lVar17];
              pMVar1 = (MDB_page *)(pcVar5 + iVar3);
              mdb_page_copy(pMVar1,local_220,my->mc_env->me_psize);
              pVar6 = my->mc_next_pgno;
              my->mc_next_pgno = pVar6 + 1;
              *(pgno_t *)(pcVar5 + iVar3) = pVar6;
              my->mc_wlen[lVar17] = my->mc_wlen[lVar17] + my->mc_env->me_psize;
              if (local_1b8.mc_top == 0) {
                *local_208 = pMVar1->mp_p;
                uVar13 = 6;
              }
              else {
                pMVar7 = local_1b8.mc_pg[local_1b8.mc_top - 1];
                uVar10 = (ulong)pMVar7->mp_ptrs[local_1b8.mc_ki[local_1b8.mc_top - 1]];
                *(undefined2 *)((long)pMVar7->mp_ptrs + (uVar10 - 0x10)) =
                     *(undefined2 *)&pMVar1->mp_p;
                *(undefined2 *)((long)pMVar7->mp_ptrs + (uVar10 - 0xe)) =
                     *(undefined2 *)((long)&pMVar1->mp_p + 2);
                *(undefined2 *)((long)pMVar7->mp_ptrs + (uVar10 - 0xc)) =
                     *(undefined2 *)((long)&pMVar1->mp_p + 4);
                uVar13 = 0;
                if (local_1b8.mc_snum != 0) {
                  local_1b8.mc_snum = local_1b8.mc_snum - 1;
                  if (local_1b8.mc_snum == 0) {
                    local_1b8.mc_flags._0_1_ = (byte)local_1b8.mc_flags & 0xfe;
                  }
                  else {
                    local_1b8.mc_top = local_1b8.mc_top - 1;
                  }
                }
              }
            }
LAB_001107a8:
            if (uVar13 < 5) {
              if (uVar13 != 0) {
                return iVar9;
              }
            }
            else if (uVar13 != 5) {
              if ((uVar13 != 6) && (uVar13 != 10)) {
                return iVar9;
              }
              break;
            }
          } while (local_1b8.mc_snum != 0);
        }
        free(local_210);
      }
    }
  }
  return iVar9;
}

Assistant:

static int ESECT
mdb_env_cwalk(mdb_copy *my, pgno_t *pg, int flags)
{
	MDB_cursor mc;
	MDB_node *ni;
	MDB_page *mo, *mp, *leaf;
	char *buf, *ptr;
	int rc, toggle;
	unsigned int i;

	/* Empty DB, nothing to do */
	if (*pg == P_INVALID)
		return MDB_SUCCESS;

	mc.mc_snum = 1;
	mc.mc_top = 0;
	mc.mc_txn = my->mc_txn;

	rc = mdb_page_get(&mc, *pg, &mc.mc_pg[0], NULL);
	if (rc)
		return rc;
	rc = mdb_page_search_root(&mc, NULL, MDB_PS_FIRST);
	if (rc)
		return rc;

	/* Make cursor pages writable */
	buf = ptr = malloc(my->mc_env->me_psize * mc.mc_snum);
	if (buf == NULL)
		return ENOMEM;

	for (i=0; i<mc.mc_top; i++) {
		mdb_page_copy((MDB_page *)ptr, mc.mc_pg[i], my->mc_env->me_psize);
		mc.mc_pg[i] = (MDB_page *)ptr;
		ptr += my->mc_env->me_psize;
	}

	/* This is writable space for a leaf page. Usually not needed. */
	leaf = (MDB_page *)ptr;

	toggle = my->mc_toggle;
	while (mc.mc_snum > 0) {
		unsigned n;
		mp = mc.mc_pg[mc.mc_top];
		n = NUMKEYS(mp);

		if (IS_LEAF(mp)) {
			if (!IS_LEAF2(mp) && !(flags & F_DUPDATA)) {
				for (i=0; i<n; i++) {
					ni = NODEPTR(mp, i);
					if (ni->mn_flags & F_BIGDATA) {
						MDB_page *omp;
						pgno_t pg;

						/* Need writable leaf */
						if (mp != leaf) {
							mc.mc_pg[mc.mc_top] = leaf;
							mdb_page_copy(leaf, mp, my->mc_env->me_psize);
							mp = leaf;
							ni = NODEPTR(mp, i);
						}

						memcpy(&pg, NODEDATA(ni), sizeof(pg));
						rc = mdb_page_get(&mc, pg, &omp, NULL);
						if (rc)
							goto done;
						if (my->mc_wlen[toggle] >= MDB_WBUF) {
							rc = mdb_env_cthr_toggle(my, 1);
							if (rc)
								goto done;
							toggle = my->mc_toggle;
						}
						mo = (MDB_page *)(my->mc_wbuf[toggle] + my->mc_wlen[toggle]);
						memcpy(mo, omp, my->mc_env->me_psize);
						mo->mp_pgno = my->mc_next_pgno;
						my->mc_next_pgno += omp->mp_pages;
						my->mc_wlen[toggle] += my->mc_env->me_psize;
						if (omp->mp_pages > 1) {
							my->mc_olen[toggle] = my->mc_env->me_psize * (omp->mp_pages - 1);
							my->mc_over[toggle] = (char *)omp + my->mc_env->me_psize;
							rc = mdb_env_cthr_toggle(my, 1);
							if (rc)
								goto done;
							toggle = my->mc_toggle;
						}
						memcpy(NODEDATA(ni), &mo->mp_pgno, sizeof(pgno_t));
					} else if (ni->mn_flags & F_SUBDATA) {
						MDB_db db;

						/* Need writable leaf */
						if (mp != leaf) {
							mc.mc_pg[mc.mc_top] = leaf;
							mdb_page_copy(leaf, mp, my->mc_env->me_psize);
							mp = leaf;
							ni = NODEPTR(mp, i);
						}

						memcpy(&db, NODEDATA(ni), sizeof(db));
						my->mc_toggle = toggle;
						rc = mdb_env_cwalk(my, &db.md_root, ni->mn_flags & F_DUPDATA);
						if (rc)
							goto done;
						toggle = my->mc_toggle;
						memcpy(NODEDATA(ni), &db, sizeof(db));
					}
				}
			}
		} else {
			mc.mc_ki[mc.mc_top]++;
			if (mc.mc_ki[mc.mc_top] < n) {
				pgno_t pg;
again:
				ni = NODEPTR(mp, mc.mc_ki[mc.mc_top]);
				pg = NODEPGNO(ni);
				rc = mdb_page_get(&mc, pg, &mp, NULL);
				if (rc)
					goto done;
				mc.mc_top++;
				mc.mc_snum++;
				mc.mc_ki[mc.mc_top] = 0;
				if (IS_BRANCH(mp)) {
					/* Whenever we advance to a sibling branch page,
					 * we must proceed all the way down to its first leaf.
					 */
					mdb_page_copy(mc.mc_pg[mc.mc_top], mp, my->mc_env->me_psize);
					goto again;
				} else
					mc.mc_pg[mc.mc_top] = mp;
				continue;
			}
		}
		if (my->mc_wlen[toggle] >= MDB_WBUF) {
			rc = mdb_env_cthr_toggle(my, 1);
			if (rc)
				goto done;
			toggle = my->mc_toggle;
		}
		mo = (MDB_page *)(my->mc_wbuf[toggle] + my->mc_wlen[toggle]);
		mdb_page_copy(mo, mp, my->mc_env->me_psize);
		mo->mp_pgno = my->mc_next_pgno++;
		my->mc_wlen[toggle] += my->mc_env->me_psize;
		if (mc.mc_top) {
			/* Update parent if there is one */
			ni = NODEPTR(mc.mc_pg[mc.mc_top-1], mc.mc_ki[mc.mc_top-1]);
			SETPGNO(ni, mo->mp_pgno);
			mdb_cursor_pop(&mc);
		} else {
			/* Otherwise we're done */
			*pg = mo->mp_pgno;
			break;
		}
	}
done:
	free(buf);
	return rc;
}